

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateCache::RefcountedTemplate::RefcountedTemplate
          (RefcountedTemplate *this,Template *ptr)

{
  int iVar1;
  
  this->ptr_ = ptr;
  this->refcount_ = 1;
  (this->mutex_).destroy_ = true;
  (this->mutex_).is_safe_ = true;
  if ((this->mutex_).is_safe_ == true) {
    iVar1 = pthread_rwlock_init((pthread_rwlock_t *)&this->mutex_,(pthread_rwlockattr_t *)0x0);
    if (iVar1 != 0) {
      abort();
    }
  }
  return;
}

Assistant:

explicit RefcountedTemplate(const Template* ptr) : ptr_(ptr), refcount_(1) { }